

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

uint8_t * __thiscall
edition_unittest::TestMixedFieldsAndExtensions::_InternalSerialize
          (TestMixedFieldsAndExtensions *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<unsigned_int> *this_00;
  int iVar1;
  char *data;
  uint8_t *puVar2;
  byte *pbVar3;
  ulong uVar4;
  uint uVar5;
  uint unaff_EBP;
  bool is_soo;
  
  if ((*(byte *)((long)&this->field_0 + 0x18) & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.a_,target);
  }
  if (*(short *)((long)&this->field_0 + 10) != 0) {
    target = google::protobuf::internal::ExtensionSet::_InternalSerializeImpl
                       (&(this->field_0)._impl_._extensions_,
                        (MessageLite *)_TestMixedFieldsAndExtensions_default_instance_,2,3,target,
                        stream);
  }
  this_00 = &(this->field_0)._impl_.b_;
  iVar1 = google::protobuf::internal::SooRep::size
                    (&this_00->soo_rep_,(*(byte *)((long)&this->field_0 + 0x20) & 4) == 0);
  if (0 < iVar1) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    is_soo = (undefined1  [16])
             ((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) ==
             (undefined1  [16])0x0;
    data = (char *)(ulong)is_soo;
    iVar1 = google::protobuf::internal::SooRep::size(&this_00->soo_rep_,is_soo);
    if (target < stream->end_) {
      unaff_EBP = iVar1 << 2;
      uVar4 = (ulong)unaff_EBP;
      *target = 0x1a;
      pbVar3 = target + 1;
      if (0x7f < unaff_EBP) {
        do {
          target = pbVar3;
          uVar5 = (uint)uVar4;
          *target = (byte)uVar4 | 0x80;
          uVar4 = uVar4 >> 7;
          pbVar3 = target + 1;
        } while (0x3fff < uVar5);
      }
      target = target + 2;
      *pbVar3 = (byte)uVar4;
      if ((undefined1  [16])((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4)
          == (undefined1  [16])0x0) {
        data = (char *)((long)&this->field_0 + 0x28);
      }
      else {
        data = google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
      }
      if ((long)(int)unaff_EBP <= (long)stream->end_ - (long)target) {
        memcpy(target,data,(ulong)unaff_EBP);
        target = target + (int)unaff_EBP;
        goto LAB_00c241b5;
      }
    }
    else {
      _InternalSerialize();
    }
    target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                       (stream,data,unaff_EBP,target);
  }
LAB_00c241b5:
  if (*(short *)((long)&this->field_0 + 10) != 0) {
    target = google::protobuf::internal::ExtensionSet::_InternalSerializeImpl
                       (&(this->field_0)._impl_._extensions_,
                        (MessageLite *)_TestMixedFieldsAndExtensions_default_instance_,4,5,target,
                        stream);
  }
  uVar4 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    puVar2 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar4 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar2;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestMixedFieldsAndExtensions::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestMixedFieldsAndExtensions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestMixedFieldsAndExtensions)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 a = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_a(), target);
  }

  // Extension range [2, 3)
  target = this_._impl_._extensions_._InternalSerialize(
      &default_instance(), 2, 3, target, stream);
  // repeated fixed32 b = 3;
  if (this_._internal_b_size() > 0) {
    target = stream->WriteFixedPacked(3, this_._internal_b(), target);
  }

  // Extension range [4, 5)
  target = this_._impl_._extensions_._InternalSerialize(
      &default_instance(), 4, 5, target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestMixedFieldsAndExtensions)
  return target;
}